

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HL1MDLLoader.cpp
# Opt level: O0

void __thiscall Assimp::MDL::HalfLife::HL1MDLLoader::read_global_info(HL1MDLLoader *this)

{
  Header_HL1 *pHVar1;
  aiNode *this_00;
  aiMetadata *paVar2;
  int32_t local_3f4;
  int local_3dc;
  int32_t local_3c4;
  int32_t local_3ac;
  int32_t local_394;
  int32_t local_36c;
  aiVector3t<float> local_300;
  allocator<char> local_2f1;
  string local_2f0;
  aiVector3t<float> local_2d0;
  allocator<char> local_2c1;
  string local_2c0;
  aiVector3t<float> local_2a0;
  allocator<char> local_291;
  string local_290;
  aiVector3t<float> local_270;
  allocator<char> local_261;
  string local_260;
  aiVector3t<float> local_240;
  allocator<char> local_231;
  string local_230;
  int32_t local_210;
  allocator<char> local_209;
  string local_208;
  int local_1e8;
  allocator<char> local_1e1;
  string local_1e0;
  int32_t local_1c0;
  allocator<char> local_1b9;
  string local_1b8;
  int32_t local_198;
  allocator<char> local_191;
  string local_190;
  int32_t local_170;
  allocator<char> local_169;
  string local_168;
  allocator<char> local_141;
  string local_140;
  int32_t local_120;
  allocator<char> local_119;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  allocator<char> local_c9;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  int local_80;
  allocator<char> local_79;
  string local_78;
  aiMetadata *local_58;
  aiMetadata *md;
  allocator<char> local_39;
  string local_38;
  aiNode *local_18;
  aiNode *global_info_node;
  HL1MDLLoader *this_local;
  
  global_info_node = (aiNode *)this;
  this_00 = (aiNode *)operator_new(0x478);
  md._3_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"<MDL_global_info>",&local_39);
  aiNode::aiNode(this_00,&local_38);
  md._3_1_ = 0;
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  local_18 = this_00;
  std::vector<aiNode_*,_std::allocator<aiNode_*>_>::push_back(&this->rootnode_children_,&local_18);
  paVar2 = aiMetadata::Alloc((this->import_settings_->read_misc_global_info & 1) * 5 + 0xb);
  local_18->mMetaData = paVar2;
  local_58 = paVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"Version",&local_79);
  local_80 = 10;
  aiMetadata::Set<int>(paVar2,0,&local_78,&local_80);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  paVar2 = local_58;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"NumBodyparts",&local_a1);
  aiMetadata::Set<int>(paVar2,1,&local_a0,&this->header_->numbodyparts);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  paVar2 = local_58;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"NumModels",&local_c9);
  aiMetadata::Set<int>(paVar2,2,&local_c8,&this->total_models_);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  paVar2 = local_58;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"NumBones",&local_f1);
  aiMetadata::Set<int>(paVar2,3,&local_f0,&this->header_->numbones);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  paVar2 = local_58;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"NumAttachments",&local_119);
  if ((this->import_settings_->read_attachments & 1U) == 0) {
    local_36c = 0;
  }
  else {
    local_36c = this->header_->numattachments;
  }
  local_120 = local_36c;
  aiMetadata::Set<int>(paVar2,4,&local_118,&local_120);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator(&local_119);
  paVar2 = local_58;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"NumSkinFamilies",&local_141);
  aiMetadata::Set<int>(paVar2,5,&local_140,&this->texture_header_->numskinfamilies);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator(&local_141);
  paVar2 = local_58;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,"NumHitboxes",&local_169);
  if ((this->import_settings_->read_hitboxes & 1U) == 0) {
    local_394 = 0;
  }
  else {
    local_394 = this->header_->numhitboxes;
  }
  local_170 = local_394;
  aiMetadata::Set<int>(paVar2,6,&local_168,&local_170);
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::~allocator(&local_169);
  paVar2 = local_58;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_190,"NumBoneControllers",&local_191);
  if ((this->import_settings_->read_bone_controllers & 1U) == 0) {
    local_3ac = 0;
  }
  else {
    local_3ac = this->header_->numbonecontrollers;
  }
  local_198 = local_3ac;
  aiMetadata::Set<int>(paVar2,7,&local_190,&local_198);
  std::__cxx11::string::~string((string *)&local_190);
  std::allocator<char>::~allocator(&local_191);
  paVar2 = local_58;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b8,"NumSequences",&local_1b9)
  ;
  if ((this->import_settings_->read_animations & 1U) == 0) {
    local_3c4 = 0;
  }
  else {
    local_3c4 = this->header_->numseq;
  }
  local_1c0 = local_3c4;
  aiMetadata::Set<int>(paVar2,8,&local_1b8,&local_1c0);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::allocator<char>::~allocator(&local_1b9);
  paVar2 = local_58;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e0,"NumBlendControllers",&local_1e1);
  if ((this->import_settings_->read_blend_controllers & 1U) == 0) {
    local_3dc = 0;
  }
  else {
    local_3dc = this->num_blend_controllers_;
  }
  local_1e8 = local_3dc;
  aiMetadata::Set<int>(paVar2,9,&local_1e0,&local_1e8);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::~allocator(&local_1e1);
  paVar2 = local_58;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_208,"NumTransitionNodes",&local_209);
  if ((this->import_settings_->read_sequence_transitions & 1U) == 0) {
    local_3f4 = 0;
  }
  else {
    local_3f4 = this->header_->numtransitions;
  }
  local_210 = local_3f4;
  aiMetadata::Set<int>(paVar2,10,&local_208,&local_210);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator(&local_209);
  paVar2 = local_58;
  if ((this->import_settings_->read_misc_global_info & 1U) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_230,"EyePosition",&local_231);
    pHVar1 = this->header_;
    aiVector3t<float>::aiVector3t
              (&local_240,pHVar1->eyeposition[0],pHVar1->eyeposition[1],pHVar1->eyeposition[2]);
    aiMetadata::Set<aiVector3t<float>>(paVar2,0xb,&local_230,&local_240);
    std::__cxx11::string::~string((string *)&local_230);
    std::allocator<char>::~allocator(&local_231);
    paVar2 = local_58;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_260,"HullMin",&local_261);
    pHVar1 = this->header_;
    aiVector3t<float>::aiVector3t(&local_270,pHVar1->min[0],pHVar1->min[1],pHVar1->min[2]);
    aiMetadata::Set<aiVector3t<float>>(paVar2,0xc,&local_260,&local_270);
    std::__cxx11::string::~string((string *)&local_260);
    std::allocator<char>::~allocator(&local_261);
    paVar2 = local_58;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_290,"HullMax",&local_291);
    pHVar1 = this->header_;
    aiVector3t<float>::aiVector3t(&local_2a0,pHVar1->max[0],pHVar1->max[1],pHVar1->max[2]);
    aiMetadata::Set<aiVector3t<float>>(paVar2,0xd,&local_290,&local_2a0);
    std::__cxx11::string::~string((string *)&local_290);
    std::allocator<char>::~allocator(&local_291);
    paVar2 = local_58;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2c0,"CollisionMin",&local_2c1);
    pHVar1 = this->header_;
    aiVector3t<float>::aiVector3t(&local_2d0,pHVar1->bbmin[0],pHVar1->bbmin[1],pHVar1->bbmin[2]);
    aiMetadata::Set<aiVector3t<float>>(paVar2,0xe,&local_2c0,&local_2d0);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::allocator<char>::~allocator(&local_2c1);
    paVar2 = local_58;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2f0,"CollisionMax",&local_2f1);
    pHVar1 = this->header_;
    aiVector3t<float>::aiVector3t(&local_300,pHVar1->bbmax[0],pHVar1->bbmax[1],pHVar1->bbmax[2]);
    aiMetadata::Set<aiVector3t<float>>(paVar2,0xf,&local_2f0,&local_300);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::allocator<char>::~allocator(&local_2f1);
  }
  return;
}

Assistant:

void HL1MDLLoader::read_global_info() {
    aiNode *global_info_node = new aiNode(AI_MDL_HL1_NODE_GLOBAL_INFO);
    rootnode_children_.push_back(global_info_node);

    aiMetadata *md = global_info_node->mMetaData = aiMetadata::Alloc(import_settings_.read_misc_global_info ? 16 : 11);
    md->Set(0, "Version", AI_MDL_HL1_VERSION);
    md->Set(1, "NumBodyparts", header_->numbodyparts);
    md->Set(2, "NumModels", total_models_);
    md->Set(3, "NumBones", header_->numbones);
    md->Set(4, "NumAttachments", import_settings_.read_attachments ? header_->numattachments : 0);
    md->Set(5, "NumSkinFamilies", texture_header_->numskinfamilies);
    md->Set(6, "NumHitboxes", import_settings_.read_hitboxes ? header_->numhitboxes : 0);
    md->Set(7, "NumBoneControllers", import_settings_.read_bone_controllers ? header_->numbonecontrollers : 0);
    md->Set(8, "NumSequences", import_settings_.read_animations ? header_->numseq : 0);
    md->Set(9, "NumBlendControllers", import_settings_.read_blend_controllers ? num_blend_controllers_ : 0);
    md->Set(10, "NumTransitionNodes", import_settings_.read_sequence_transitions ? header_->numtransitions : 0);

    if (import_settings_.read_misc_global_info) {
        md->Set(11, "EyePosition", aiVector3D(header_->eyeposition[0], header_->eyeposition[1], header_->eyeposition[2]));
        md->Set(12, "HullMin", aiVector3D(header_->min[0], header_->min[1], header_->min[2]));
        md->Set(13, "HullMax", aiVector3D(header_->max[0], header_->max[1], header_->max[2]));
        md->Set(14, "CollisionMin", aiVector3D(header_->bbmin[0], header_->bbmin[1], header_->bbmin[2]));
        md->Set(15, "CollisionMax", aiVector3D(header_->bbmax[0], header_->bbmax[1], header_->bbmax[2]));
    }
}